

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::StreamArchive::decode_payload_uncompressed
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  int iVar1;
  LogLevel LVar2;
  size_t sVar3;
  mz_ulong mVar4;
  ulong __n;
  bool bVar5;
  
  if ((entry->header).uncompressed_size != blob_size) {
    return false;
  }
  if ((entry->header).payload_size != blob_size) {
    return false;
  }
  if ((concurrent) && (iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->read_lock), iVar1 != 0))
  {
    std::__throw_system_error(iVar1);
  }
  bVar5 = false;
  iVar1 = fseek((FILE *)this->file,entry->offset,0);
  if (-1 < iVar1) {
    __n = (ulong)(entry->header).payload_size;
    sVar3 = fread(blob,1,__n,(FILE *)this->file);
    bVar5 = sVar3 == __n;
  }
  if (concurrent) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->read_lock);
  }
  if (bVar5) {
    if ((entry->header).crc == 0) {
      return true;
    }
    mVar4 = mz_crc32(0,(mz_uint8 *)blob,blob_size);
    if ((entry->header).crc == (uint32_t)mVar4) {
      return true;
    }
    LVar2 = get_thread_log_level();
    if ((int)LVar2 < 3) {
      bVar5 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n");
      if (bVar5) {
        return false;
      }
      decode_payload_uncompressed();
    }
  }
  return false;
}

Assistant:

bool decode_payload_uncompressed(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size || entry.header.payload_size != blob_size)
			return false;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;

			size_t read_size = entry.header.payload_size;
			if (fread(blob, 1, read_size, file) != read_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<unsigned char *>(blob), blob_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		return true;
	}